

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall
crnlib::symbol_codec::encode
          (symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  uint *puVar1;
  ushort uVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  this->m_arith_total_bits = this->m_arith_total_bits + 1;
  if (this->m_simulate_encoding == false) {
    uVar2 = model->m_bit_0_prob;
    uVar6 = (this->m_output_syms).m_size;
    if ((this->m_output_syms).m_capacity <= uVar6) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_output_syms,uVar6 + 1,true,8,(object_mover)0x0,false);
      uVar6 = (this->m_output_syms).m_size;
    }
    (this->m_output_syms).m_p[uVar6] =
         (output_symbol)((ulong)bit | (ulong)uVar2 << 0x30 | 0xffff00000000);
    puVar1 = &(this->m_output_syms).m_size;
    *puVar1 = *puVar1 + 1;
  }
  uVar2 = model->m_bit_0_prob;
  uVar6 = this->m_arith_length;
  uVar4 = (uVar6 >> 0xb) * (uint)uVar2;
  if (bit == 0) {
    if (update_model) {
      model->m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
    }
    this->m_arith_length = uVar4;
  }
  else {
    if (update_model) {
      model->m_bit_0_prob = uVar2 - (uVar2 >> 5);
    }
    uVar6 = uVar6 - uVar4;
    puVar1 = &this->m_arith_base;
    bVar7 = CARRY4(*puVar1,uVar4);
    *puVar1 = *puVar1 + uVar4;
    this->m_arith_length = uVar6;
    uVar4 = uVar6;
    if (bVar7) {
      uVar6 = (this->m_arith_output_buf).m_size;
      uVar5 = (ulong)uVar6;
      if (-1 < (int)(uVar6 - 1)) {
        do {
          uVar6 = (int)uVar5 - 1;
          uVar5 = (ulong)uVar6;
          puVar3 = (this->m_arith_output_buf).m_p;
          if (puVar3[uVar5] != 0xff) {
            puVar3[uVar5] = puVar3[uVar5] + '\x01';
            break;
          }
          puVar3[uVar5] = '\0';
        } while (0 < (int)uVar6);
      }
      uVar4 = this->m_arith_length;
    }
  }
  if (0xffffff < uVar4) {
    return;
  }
  arith_renorm_enc_interval(this);
  return;
}

Assistant:

void symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        m_arith_total_bits++;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bit;
            sym.m_num_bits = -1;
            sym.m_arith_prob0 = model.m_bit_0_prob;
            m_output_syms.push_back(sym);
        }

        //uint x = gArithProbMulTab[model.m_bit_0_prob >> (cSymbolCodecArithProbBits - cSymbolCodecArithProbMulBits)][m_arith_length >> (32 - cSymbolCodecArithProbMulLenSigBits)] << 16;
        uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

        if (!bit)
        {
            if (update_model)
            {
                model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);
            }

            m_arith_length = x;
        }
        else
        {
            if (update_model)
            {
                model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);
            }

            uint orig_base = m_arith_base;
            m_arith_base += x;
            m_arith_length -= x;
            if (orig_base > m_arith_base)
            {
                arith_propagate_carry();
            }
        }

        if (m_arith_length < cSymbolCodecArithMinLen)
        {
            arith_renorm_enc_interval();
        }
    }